

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *elem,xmlChar *name,xmlChar *ns,
                   xmlAttributeType type,xmlAttributeDefault def,xmlChar *defaultValue,
                   xmlEnumerationPtr tree)

{
  xmlDocPtr doc;
  _xmlDoc *p_Var1;
  _xmlNode *p_Var2;
  xmlValidState *pxVar3;
  int iVar4;
  xmlHashTablePtr pxVar5;
  xmlAttributePtr attr;
  xmlChar *pxVar6;
  void *pvVar7;
  xmlValidityWarningFunc p_Var8;
  xmlAutomataPtr pxVar9;
  xmlValidState *pxVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  xmlHashTablePtr name_00;
  _xmlDict *p_Var11;
  char *pcVar12;
  undefined4 in_register_0000008c;
  xmlValidCtxtPtr local_60;
  xmlChar *local_48;
  xmlHashTablePtr local_40;
  undefined8 local_38;
  
  if (((dtd == (xmlDtdPtr)0x0) || (name == (xmlChar *)0x0)) || (elem == (xmlChar *)0x0))
  goto LAB_0018ee3d;
  doc = dtd->doc;
  if (doc == (xmlDocPtr)0x0) {
    p_Var11 = (xmlDictPtr)0x0;
  }
  else {
    p_Var11 = doc->dict;
  }
  if (9 < type - XML_ATTRIBUTE_CDATA) {
    xmlErrValid(ctxt,XML_ERR_INTERNAL_ERROR,"Internal: ATTRIBUTE struct corrupted invalid type\n",
                (char *)0x0);
    xmlFreeEnumeration(tree);
    return (xmlAttributePtr)0x0;
  }
  local_38 = CONCAT44(in_register_0000008c,type);
  if (defaultValue == (xmlChar *)0x0) {
    local_60 = (xmlValidCtxtPtr)0x0;
  }
  else {
    iVar4 = xmlValidateAttributeValueInternal(doc,type,defaultValue);
    if (iVar4 == 0) {
      xmlErrValidNode(ctxt,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_DEFAULT,
                      "Attribute %s of %s: invalid default value\n",elem,name,defaultValue);
      if (ctxt != (xmlValidCtxtPtr)0x0) {
        ctxt->valid = 0;
      }
      local_60 = (xmlValidCtxtPtr)0x0;
    }
    else {
      local_60 = (xmlValidCtxtPtr)defaultValue;
    }
  }
  p_Var1 = dtd->doc;
  if (((p_Var1 != (_xmlDoc *)0x0) && (p_Var1->extSubset == dtd)) &&
     ((p_Var1->intSubset != (_xmlDtd *)0x0 &&
      ((pxVar5 = (xmlHashTablePtr)p_Var1->intSubset->attributes, pxVar5 != (xmlHashTablePtr)0x0 &&
       (pvVar7 = xmlHashLookup3(pxVar5,name,ns,elem), pvVar7 != (void *)0x0)))))) goto LAB_0018ee3d;
  pxVar5 = (xmlHashTablePtr)dtd->attributes;
  if (pxVar5 == (xmlHashTablePtr)0x0) {
    pxVar5 = xmlHashCreateDict(0,p_Var11);
    dtd->attributes = pxVar5;
    if (pxVar5 != (xmlHashTablePtr)0x0) goto LAB_0018ec67;
    pcVar12 = "xmlAddAttributeDecl: Table creation failed!\n";
  }
  else {
LAB_0018ec67:
    local_40 = pxVar5;
    attr = (xmlAttributePtr)(*xmlMalloc)(0x78);
    if (attr != (xmlAttributePtr)0x0) {
      attr->_private = (void *)0x0;
      *(undefined8 *)&attr->type = 0;
      attr->atype = 0;
      attr->def = 0;
      attr->defaultValue = (xmlChar *)0x0;
      attr->tree = (xmlEnumerationPtr)0x0;
      attr->prefix = (xmlChar *)0x0;
      attr->doc = (_xmlDoc *)0x0;
      attr->nexth = (_xmlAttribute *)0x0;
      attr->next = (_xmlNode *)0x0;
      attr->prev = (_xmlNode *)0x0;
      attr->last = (_xmlNode *)0x0;
      attr->parent = (_xmlDtd *)0x0;
      attr->name = (xmlChar *)0x0;
      attr->children = (_xmlNode *)0x0;
      attr->elem = (xmlChar *)0x0;
      attr->type = XML_ATTRIBUTE_DECL;
      attr->atype = (xmlAttributeType)local_38;
      attr->doc = dtd->doc;
      if (p_Var11 == (xmlDictPtr)0x0) {
        pxVar6 = xmlStrdup(name);
        attr->name = pxVar6;
        pxVar6 = xmlStrdup(ns);
        attr->prefix = pxVar6;
        pxVar6 = xmlStrdup(elem);
        attr->elem = pxVar6;
        attr->def = def;
        attr->tree = tree;
        if (local_60 != (xmlValidCtxtPtr)0x0) {
          pxVar6 = xmlStrdup((xmlChar *)local_60);
          goto LAB_0018edb6;
        }
      }
      else {
        pxVar6 = xmlDictLookup(p_Var11,name,-1);
        attr->name = pxVar6;
        pxVar6 = xmlDictLookup(p_Var11,ns,-1);
        attr->prefix = pxVar6;
        pxVar6 = xmlDictLookup(p_Var11,elem,-1);
        attr->elem = pxVar6;
        attr->def = def;
        attr->tree = tree;
        if (local_60 != (xmlValidCtxtPtr)0x0) {
          pxVar6 = xmlDictLookup(p_Var11,(xmlChar *)local_60,-1);
LAB_0018edb6:
          attr->defaultValue = pxVar6;
        }
      }
      iVar4 = xmlHashAddEntry3(local_40,attr->name,attr->prefix,attr->elem,attr);
      if (iVar4 < 0) {
        xmlErrValidWarning(ctxt,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_REDEFINED,
                           "Attribute %s of element %s: already defined\n",name,elem,(xmlChar *)0x0)
        ;
        xmlFreeAttribute(attr);
        return (xmlAttributePtr)0x0;
      }
      local_48 = (xmlChar *)0x0;
      pxVar5 = (xmlHashTablePtr)dtd->elements;
      if (pxVar5 == (xmlHashTablePtr)0x0) {
        if (dtd->doc == (_xmlDoc *)0x0) {
          p_Var11 = (xmlDictPtr)0x0;
        }
        else {
          p_Var11 = dtd->doc->dict;
        }
        pxVar5 = xmlHashCreateDict(0,p_Var11);
        dtd->elements = pxVar5;
        if (pxVar5 != (xmlHashTablePtr)0x0) goto LAB_0018ee73;
        pcVar12 = "element table allocation failed";
LAB_0018f03d:
        xmlVErrMemory((xmlValidCtxtPtr)0x0,pcVar12);
      }
      else {
LAB_0018ee73:
        local_40 = (xmlHashTablePtr)xmlSplitQName2(elem,&local_48);
        name_00 = local_40;
        if (local_40 == (xmlHashTablePtr)0x0) {
          name_00 = (xmlHashTablePtr)elem;
        }
        local_60 = (xmlValidCtxtPtr)xmlHashLookup2(pxVar5,(xmlChar *)name_00,local_48);
        iVar4 = extraout_EDX;
        if (local_60 == (xmlValidCtxtPtr)0x0) {
          local_60 = (xmlValidCtxtPtr)(*xmlMalloc)(0x70);
          if (local_60 == (xmlValidCtxtPtr)0x0) {
            pcVar12 = "malloc failed";
            goto LAB_0018f03d;
          }
          local_60->userData = (void *)0x0;
          local_60->error = (xmlValidityErrorFunc)0x0;
          local_60->am = (xmlAutomataPtr)0x0;
          local_60->state = (xmlAutomataStatePtr)0x0;
          local_60->vstateNr = 0;
          local_60->vstateMax = 0;
          local_60->vstateTab = (xmlValidState *)0x0;
          *(undefined8 *)&local_60->valid = 0;
          local_60->vstate = (xmlValidState *)0x0;
          *(undefined8 *)&local_60->finishDtd = 0;
          local_60->doc = (xmlDocPtr)0x0;
          local_60->nodeNr = 0;
          local_60->nodeMax = 0;
          local_60->nodeTab = (xmlNodePtr *)0x0;
          local_60->warning = (xmlValidityWarningFunc)0x0;
          local_60->node = (xmlNodePtr)0x0;
          *(undefined4 *)&local_60->error = 0xf;
          p_Var8 = (xmlValidityWarningFunc)xmlStrdup((xmlChar *)name_00);
          local_60->warning = p_Var8;
          pxVar9 = (xmlAutomataPtr)xmlStrdup(local_48);
          local_60->am = pxVar9;
          *(undefined4 *)&local_60->vstate = 0;
          xmlHashAddEntry2(pxVar5,(xmlChar *)name_00,local_48,local_60);
          iVar4 = extraout_EDX_00;
        }
        if (local_48 != (xmlChar *)0x0) {
          (*xmlFree)(local_48);
          iVar4 = extraout_EDX_01;
        }
        if (local_40 != (xmlHashTablePtr)0x0) {
          (*xmlFree)(local_40);
          iVar4 = extraout_EDX_02;
        }
        if ((((int)local_38 == 2) &&
            (iVar4 = xmlScanIDAttributeDecl(local_60,(xmlElementPtr)0x1,iVar4), iVar4 != 0)) &&
           (xmlErrValidNode(ctxt,(xmlNodePtr)dtd,XML_DTD_MULTIPLE_ID,
                            "Element %s has too may ID attributes defined : %s\n",elem,name,
                            (xmlChar *)0x0), ctxt != (xmlValidCtxtPtr)0x0)) {
          ctxt->valid = 0;
        }
        iVar4 = xmlStrEqual(attr->name,"xmlns");
        if ((iVar4 == 0) &&
           ((attr->prefix == (xmlChar *)0x0 ||
            (iVar4 = xmlStrEqual(attr->prefix,"xmlns"), iVar4 == 0)))) {
          pxVar3 = local_60->vstateTab;
          do {
            pxVar10 = pxVar3;
            if (pxVar10 == (xmlValidState *)0x0) goto LAB_0018efb1;
            iVar4 = xmlStrEqual((xmlChar *)pxVar10->exec,"xmlns");
          } while (((iVar4 != 0) ||
                   ((attr->prefix != (xmlChar *)0x0 &&
                    (iVar4 = xmlStrEqual(attr->prefix,"xmlns"), iVar4 != 0)))) &&
                  (pxVar3 = (xmlValidState *)pxVar10[3].elemDecl,
                  (xmlValidState *)pxVar10[3].elemDecl != (xmlValidState *)0x0));
          attr->nexth = (_xmlAttribute *)pxVar10[3].elemDecl;
          pxVar10[3].elemDecl = (xmlElementPtr)attr;
        }
        else {
LAB_0018efb1:
          attr->nexth = (_xmlAttribute *)local_60->vstateTab;
          local_60->vstateTab = (xmlValidState *)attr;
        }
      }
      attr->parent = dtd;
      p_Var2 = dtd->last;
      if (p_Var2 == (_xmlNode *)0x0) {
        dtd->last = (_xmlNode *)attr;
        dtd->children = (_xmlNode *)attr;
        return attr;
      }
      p_Var2->next = (_xmlNode *)attr;
      attr->prev = p_Var2;
      dtd->last = (_xmlNode *)attr;
      return attr;
    }
    pcVar12 = "malloc failed";
  }
  xmlVErrMemory(ctxt,pcVar12);
LAB_0018ee3d:
  xmlFreeEnumeration(tree);
  return (xmlAttributePtr)0x0;
}

Assistant:

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,
                    xmlDtdPtr dtd, const xmlChar *elem,
                    const xmlChar *name, const xmlChar *ns,
		    xmlAttributeType type, xmlAttributeDefault def,
		    const xmlChar *defaultValue, xmlEnumerationPtr tree) {
    xmlAttributePtr ret;
    xmlAttributeTablePtr table;
    xmlElementPtr elemDef;
    xmlDictPtr dict = NULL;

    if (dtd == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (name == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (elem == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (dtd->doc != NULL)
	dict = dtd->doc->dict;

#ifdef LIBXML_VALID_ENABLED
    /*
     * Check the type and possibly the default value.
     */
    switch (type) {
        case XML_ATTRIBUTE_CDATA:
	    break;
        case XML_ATTRIBUTE_ID:
	    break;
        case XML_ATTRIBUTE_IDREF:
	    break;
        case XML_ATTRIBUTE_IDREFS:
	    break;
        case XML_ATTRIBUTE_ENTITY:
	    break;
        case XML_ATTRIBUTE_ENTITIES:
	    break;
        case XML_ATTRIBUTE_NMTOKEN:
	    break;
        case XML_ATTRIBUTE_NMTOKENS:
	    break;
        case XML_ATTRIBUTE_ENUMERATION:
	    break;
        case XML_ATTRIBUTE_NOTATION:
	    break;
	default:
	    xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		    "Internal: ATTRIBUTE struct corrupted invalid type\n",
		    NULL);
	    xmlFreeEnumeration(tree);
	    return(NULL);
    }
    if ((defaultValue != NULL) &&
        (!xmlValidateAttributeValueInternal(dtd->doc, type, defaultValue))) {
	xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ATTRIBUTE_DEFAULT,
	                "Attribute %s of %s: invalid default value\n",
	                elem, name, defaultValue);
	defaultValue = NULL;
	if (ctxt != NULL)
	    ctxt->valid = 0;
    }
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check first that an attribute defined in the external subset wasn't
     * already defined in the internal subset
     */
    if ((dtd->doc != NULL) && (dtd->doc->extSubset == dtd) &&
	(dtd->doc->intSubset != NULL) &&
	(dtd->doc->intSubset->attributes != NULL)) {
        ret = xmlHashLookup3(dtd->doc->intSubset->attributes, name, ns, elem);
	if (ret != NULL) {
	    xmlFreeEnumeration(tree);
	    return(NULL);
	}
    }

    /*
     * Create the Attribute table if needed.
     */
    table = (xmlAttributeTablePtr) dtd->attributes;
    if (table == NULL) {
        table = xmlHashCreateDict(0, dict);
	dtd->attributes = (void *) table;
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
            "xmlAddAttributeDecl: Table creation failed!\n");
	xmlFreeEnumeration(tree);
        return(NULL);
    }


    ret = (xmlAttributePtr) xmlMalloc(sizeof(xmlAttribute));
    if (ret == NULL) {
	xmlVErrMemory(ctxt, "malloc failed");
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlAttribute));
    ret->type = XML_ATTRIBUTE_DECL;

    /*
     * fill the structure.
     */
    ret->atype = type;
    /*
     * doc must be set before possible error causes call
     * to xmlFreeAttribute (because it's used to check on
     * dict use)
     */
    ret->doc = dtd->doc;
    if (dict) {
	ret->name = xmlDictLookup(dict, name, -1);
	ret->prefix = xmlDictLookup(dict, ns, -1);
	ret->elem = xmlDictLookup(dict, elem, -1);
    } else {
	ret->name = xmlStrdup(name);
	ret->prefix = xmlStrdup(ns);
	ret->elem = xmlStrdup(elem);
    }
    ret->def = def;
    ret->tree = tree;
    if (defaultValue != NULL) {
        if (dict)
	    ret->defaultValue = xmlDictLookup(dict, defaultValue, -1);
	else
	    ret->defaultValue = xmlStrdup(defaultValue);
    }

    /*
     * Validity Check:
     * Search the DTD for previous declarations of the ATTLIST
     */
    if (xmlHashAddEntry3(table, ret->name, ret->prefix, ret->elem, ret) < 0) {
#ifdef LIBXML_VALID_ENABLED
	/*
	 * The attribute is already defined in this DTD.
	 */
	xmlErrValidWarning(ctxt, (xmlNodePtr) dtd, XML_DTD_ATTRIBUTE_REDEFINED,
		 "Attribute %s of element %s: already defined\n",
		 name, elem, NULL);
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeAttribute(ret);
	return(NULL);
    }

    /*
     * Validity Check:
     * Multiple ID per element
     */
    elemDef = xmlGetDtdElementDesc2(dtd, elem, 1);
    if (elemDef != NULL) {

#ifdef LIBXML_VALID_ENABLED
        if ((type == XML_ATTRIBUTE_ID) &&
	    (xmlScanIDAttributeDecl(NULL, elemDef, 1) != 0)) {
	    xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_MULTIPLE_ID,
	   "Element %s has too may ID attributes defined : %s\n",
		   elem, name, NULL);
	    if (ctxt != NULL)
		ctxt->valid = 0;
	}
#endif /* LIBXML_VALID_ENABLED */

	/*
	 * Insert namespace default def first they need to be
	 * processed first.
	 */
	if ((xmlStrEqual(ret->name, BAD_CAST "xmlns")) ||
	    ((ret->prefix != NULL &&
	     (xmlStrEqual(ret->prefix, BAD_CAST "xmlns"))))) {
	    ret->nexth = elemDef->attributes;
	    elemDef->attributes = ret;
	} else {
	    xmlAttributePtr tmp = elemDef->attributes;

	    while ((tmp != NULL) &&
		   ((xmlStrEqual(tmp->name, BAD_CAST "xmlns")) ||
		    ((ret->prefix != NULL &&
		     (xmlStrEqual(ret->prefix, BAD_CAST "xmlns")))))) {
		if (tmp->nexth == NULL)
		    break;
		tmp = tmp->nexth;
	    }
	    if (tmp != NULL) {
		ret->nexth = tmp->nexth;
	        tmp->nexth = ret;
	    } else {
		ret->nexth = elemDef->attributes;
		elemDef->attributes = ret;
	    }
	}
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    return(ret);
}